

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O1

int __thiscall lsvm::hashset::remove(hashset *this,char *__filename)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  uint uVar5;
  hash hVar6;
  ulong uVar7;
  equals_fp p_Var8;
  equals_fp p_Var9;
  uint uVar10;
  equals_fp p_Var11;
  uint uVar12;
  hash local_48;
  
  hVar6 = (*this->hash)(__filename);
  p_Var8 = (&this[1].equals)[(uint)this->bits & (uint)hVar6];
LAB_00105524:
  if (p_Var8 == (equals_fp)0x0) {
    return 0;
  }
  uVar1 = (&primes)[*(uint *)(p_Var8 + 0xc)];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = hVar6;
  uVar7 = SUB168(auVar2 % ZEXT416(uVar1),0);
  p_Var11 = p_Var8 + (uVar7 * 2 + 2) * 8;
  uVar5 = uVar1 - 1;
  uVar10 = (this->range * uVar1) / 100000;
  if (uVar1 <= uVar10) {
    uVar10 = uVar5;
  }
  uVar12 = uVar10 + SUB164(auVar2 % ZEXT416(uVar1),0);
  if (uVar1 <= uVar12) {
    p_Var9 = p_Var8 + 0x10;
    if (uVar7 <= uVar5) {
      do {
        if (((*(hash *)p_Var11 == hVar6) && (*(void **)(p_Var11 + 8) != (void *)0x0)) &&
           (bVar4 = (*this->equals)(__filename,*(void **)(p_Var11 + 8)), bVar4)) goto LAB_00105658;
        p_Var11 = p_Var11 + 0x10;
      } while (p_Var11 <= p_Var9 + (ulong)uVar5 * 0x10);
    }
    do {
      if (((*(hash *)p_Var9 == hVar6) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
         (bVar4 = (*this->equals)(__filename,*(void **)(p_Var9 + 8)), p_Var11 = p_Var9, bVar4))
      goto LAB_00105658;
      p_Var9 = p_Var9 + 0x10;
    } while (p_Var9 <= p_Var8 + ((ulong)(uVar12 - uVar1) * 2 + 2) * 8);
    bVar4 = true;
    goto LAB_00105677;
  }
  p_Var9 = p_Var11 + (ulong)uVar10 * 0x10;
  bVar4 = false;
  do {
    if (((*(hash *)p_Var11 == hVar6) && (*(void **)(p_Var11 + 8) != (void *)0x0)) &&
       (bVar3 = (*this->equals)(__filename,*(void **)(p_Var11 + 8)), bVar3)) {
      local_48 = *(hash *)(p_Var11 + 8);
      *(hash *)p_Var11 = 0;
      *(hash *)(p_Var11 + 8) = 0;
      *(int *)(p_Var8 + 8) = *(int *)(p_Var8 + 8) + -1;
      this->count = this->count - 1;
      break;
    }
    p_Var11 = p_Var11 + 0x10;
    bVar4 = p_Var9 < p_Var11;
  } while (p_Var11 <= p_Var9);
  if (!bVar4) goto LAB_0010567b;
  goto LAB_0010564e;
LAB_00105658:
  local_48 = *(hash *)(p_Var11 + 8);
  *(hash *)p_Var11 = 0;
  *(hash *)(p_Var11 + 8) = 0;
  *(int *)(p_Var8 + 8) = *(int *)(p_Var8 + 8) + -1;
  this->count = this->count - 1;
  bVar4 = false;
LAB_00105677:
  if (bVar4) {
LAB_0010564e:
    p_Var8 = *(equals_fp *)p_Var8;
    bVar4 = true;
  }
  else {
LAB_0010567b:
    bVar4 = false;
  }
  if (!bVar4) {
    return (int)local_48;
  }
  goto LAB_00105524;
}

Assistant:

void* remove(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *(partition(h,bit));

    // find key in a bucket using open address
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    return null;
}